

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O0

void __thiscall CTcGenTarg::build_source_line_maps(CTcGenTarg *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  CTcTokFileDesc *this_00;
  CTcTokFileDesc *pCVar5;
  CTcTokFileDesc *file_desc;
  ulong line_addr;
  uint method_ofs;
  ulong linenum;
  uint file_id;
  ulong ofs;
  uint cnt;
  ulong dbg_ofs;
  ulong start_addr;
  ulong start_ofs;
  CTcStreamAnchor *anchor;
  ulong in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  CTcStreamAnchor *local_10;
  
  for (local_10 = CTcDataStream::get_first_anchor(&G_cs->super_CTcDataStream);
      local_10 != (CTcStreamAnchor *)0x0; local_10 = local_10->nxt_) {
    uVar3 = CTcStreamAnchor::get_ofs(local_10);
    uVar4 = CTcStreamAnchor::get_addr(local_10);
    uVar1 = CTcDataStream::readu2_at
                      ((CTcDataStream *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
    if (uVar3 + uVar1 != uVar3) {
      uVar2 = CTcDataStream::readu2_at
                        ((CTcDataStream *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffa8);
      uVar3 = uVar3 + uVar1 + (long)G_sizes.dbg_hdr + 2;
      for (; uVar2 != 0; uVar2 = uVar2 - 1) {
        in_stack_ffffffffffffffb4 =
             CTcDataStream::readu2_at
                       ((CTcDataStream *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffa8);
        uVar1 = CTcDataStream::readu2_at
                          ((CTcDataStream *)
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           in_stack_ffffffffffffffa8);
        CTcDataStream::readu4_at
                  ((CTcDataStream *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8);
        in_stack_ffffffffffffffa8 = uVar4 + in_stack_ffffffffffffffb4;
        this_00 = CTcTokenizer::get_filedesc(G_tok,(ulong)uVar1);
        pCVar5 = CTcTokFileDesc::get_orig(this_00);
        if (pCVar5 != (CTcTokFileDesc *)0x0) {
          CTcTokFileDesc::get_orig(this_00);
        }
        CTcTokFileDesc::add_source_line
                  ((CTcTokFileDesc *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),uVar3,
                   CONCAT44(uVar1,in_stack_ffffffffffffffc0));
        uVar3 = (long)G_sizes.dbg_line + uVar3;
      }
    }
  }
  return;
}

Assistant:

void CTcGenTarg::build_source_line_maps()
{
    CTcStreamAnchor *anchor;

    /* go through the list of anchors in the code stream */
    for (anchor = G_cs->get_first_anchor() ; anchor != 0 ;
         anchor = anchor->nxt_)
    {
        ulong start_ofs;
        ulong start_addr;
        ulong dbg_ofs;
        uint cnt;
        ulong ofs;

        /* get the anchor's stream offset */
        start_ofs = anchor->get_ofs();

        /* get the anchor's absolute address in the image file */
        start_addr = anchor->get_addr();

        /* read the debug table offset from the method header */
        dbg_ofs = start_ofs + G_cs->readu2_at(start_ofs + 8);

        /* if there's no debug table for this method, go on to the next */
        if (dbg_ofs == start_ofs)
            continue;

        /* read the number of line entries */
        cnt = G_cs->readu2_at(dbg_ofs + G_sizes.dbg_hdr);

        /* go through the individual line entries */
        for (ofs = dbg_ofs + G_sizes.dbg_hdr + 2 ; cnt != 0 ;
             --cnt, ofs += G_sizes.dbg_line)
        {
            uint file_id;
            ulong linenum;
            uint method_ofs;
            ulong line_addr;
            CTcTokFileDesc *file_desc;
            
            /* 
             *   get the file position, and the byte-code offset from the
             *   start of the method of the executable code for the line 
             */
            method_ofs = G_cs->readu2_at(ofs);
            file_id = G_cs->readu2_at(ofs + 2);
            linenum = G_cs->readu4_at(ofs + 4);

            /* calculate the absolute address of the line in the image file */
            line_addr = start_addr + method_ofs;

            /* find the given file descriptor */
            file_desc = G_tok->get_filedesc(file_id);

            /* 
             *   get the original file descriptor, since we always want to
             *   add to the original, not to the duplicates, if the file
             *   appears more than once (because this is a one-way mapping
             *   from file to byte-code location - we thus require a
             *   single index)
             */
            if (file_desc->get_orig() != 0)
                file_desc = file_desc->get_orig();

            /* add this line to the file descriptor */
            file_desc->add_source_line(linenum, line_addr);
        }
    }
}